

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_atanh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  unkuint10 Var3;
  flag zSign;
  int32_t aExp_00;
  int32_t iVar4;
  uint64_t aSig_00;
  uint16_t uVar5;
  undefined8 extraout_RDX;
  floatx80 fVar6;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 fVar9;
  floatx80 fVar10;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 one;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var3 = a._0_10_;
  fVar7._10_6_ = 0;
  fVar7.low = (long)Var3;
  fVar7.high = (short)(Var3 >> 0x40);
  aSig_00 = extractFloatx80Frac(fVar7);
  fVar8._10_6_ = 0;
  fVar8.low = (long)Var3;
  fVar8.high = (short)(Var3 >> 0x40);
  aExp_00 = extractFloatx80Exp(fVar8);
  fVar9._10_6_ = 0;
  fVar9.low = (long)Var3;
  fVar9.high = (short)(Var3 >> 0x40);
  zSign = extractFloatx80Sign(fVar9);
  if ((aExp_00 == 0x7fff) && ((aSig_00 & 0x7fffffffffffffff) != 0)) {
    a_00._10_6_ = 0;
    a_00.low = (long)Var3;
    a_00.high = (short)(Var3 >> 0x40);
    fVar6 = propagateFloatx80NaNOneArg(a_00,status);
    uVar5 = fVar6.high;
  }
  else if ((aExp_00 == 0) && (aSig_00 == 0)) {
    fVar6 = packFloatx80(zSign,0,0);
    uVar5 = fVar6.high;
  }
  else {
    iVar4 = floatx80_make_compact(aExp_00,aSig_00);
    if (iVar4 < 0x3fff8000) {
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      fVar7 = packFloatx80('\0',0x3fff,0x8000000000000000);
      fVar8 = packFloatx80(zSign,0x3ffe,0x8000000000000000);
      fVar9 = packFloatx80('\0',aExp_00,aSig_00);
      fVar6 = packFloatx80('\x01',aExp_00,aSig_00);
      Var3 = fVar9._0_10_;
      a_01._10_6_ = 0;
      a_01.low = (long)Var3;
      a_01.high = (short)(Var3 >> 0x40);
      b._10_6_ = 0;
      b.low = (long)Var3;
      b.high = (short)(Var3 >> 0x40);
      fVar9 = floatx80_add_m68k(a_01,b,status);
      a_02._10_6_ = 0;
      a_02.low = (long)fVar6._0_10_;
      a_02.high = (short)(fVar6._0_10_ >> 0x40);
      b_00._10_6_ = 0;
      b_00.low = (long)fVar7._0_10_;
      b_00.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_add_m68k(a_02,b_00,status);
      a_03._10_6_ = 0;
      a_03.low = (long)fVar9._0_10_;
      a_03.high = (short)(fVar9._0_10_ >> 0x40);
      b_01._10_6_ = 0;
      b_01.low = (long)fVar7._0_10_;
      b_01.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_div_m68k(a_03,b_01,status);
      a_04._10_6_ = 0;
      a_04.low = (long)fVar7._0_10_;
      a_04.high = (short)(fVar7._0_10_ >> 0x40);
      fVar7 = floatx80_lognp1_m68k(a_04,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_05._10_6_ = 0;
      a_05.low = (long)fVar7._0_10_;
      a_05.high = (short)(fVar7._0_10_ >> 0x40);
      b_02._10_6_ = 0;
      b_02.low = (long)fVar8._0_10_;
      b_02.high = (short)(fVar8._0_10_ >> 0x40);
      fVar7 = floatx80_mul_m68k(a_05,b_02,status);
      uVar5 = fVar7.high;
      float_raise_m68k(' ',status);
      fVar6._8_8_ = extraout_RDX;
      fVar6.low = fVar7.low;
    }
    else if ((aExp_00 == 0x3fff) && (aSig_00 == 0x8000000000000000)) {
      float_raise_m68k('\x04',status);
      fVar6 = packFloatx80(zSign,0x7fff,0);
      uVar5 = fVar6.high;
    }
    else {
      float_raise_m68k('\x01',status);
      fVar6 = floatx80_default_nan_m68k(status);
      uVar5 = fVar6.high;
    }
  }
  a_local._8_8_ = fVar6.low;
  fVar10._10_6_ = fVar6._10_6_;
  fVar10.high = uVar5;
  fVar10.low = a_local._8_8_;
  return fVar10;
}

Assistant:

floatx80 floatx80_atanh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2, one;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF && (uint64_t) (aSig << 1)) {
        return propagateFloatx80NaNOneArg(a, status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    compact = floatx80_make_compact(aExp, aSig);

    if (compact >= 0x3FFF8000) { /* |X| >= 1 */
        if (aExp == one_exp && aSig == one_sig) { /* |X| == 1 */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(aSign, floatx80_infinity.high,
                                floatx80_infinity.low);
        } else { /* |X| > 1 */
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
    } /* |X| < 1 */

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    one = packFloatx80(0, one_exp, one_sig);
    fp2 = packFloatx80(aSign, 0x3FFE, one_sig); /* SIGN(X) * (1/2) */
    fp0 = packFloatx80(0, aExp, aSig); /* Y = |X| */
    fp1 = packFloatx80(1, aExp, aSig); /* -Y */
    fp0 = floatx80_add(fp0, fp0, status); /* 2Y */
    fp1 = floatx80_add(fp1, one, status); /* 1-Y */
    fp0 = floatx80_div(fp0, fp1, status); /* Z = 2Y/(1-Y) */
    fp0 = floatx80_lognp1(fp0, status); /* LOG1P(Z) */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_mul(fp0, fp2,
                     status); /* ATANH(X) = SIGN(X) * (1/2) * LOG1P(Z) */

    float_raise(float_flag_inexact, status);

    return a;
}